

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeCase::test
          (UnspecifiedAttachmentSizeCase *this)

{
  GLuint local_14;
  UnspecifiedAttachmentSizeCase *pUStack_10;
  GLuint framebufferID;
  UnspecifiedAttachmentSizeCase *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  glu::CallLogWrapper::glGenFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])();
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])();
  glu::CallLogWrapper::glDeleteFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14)
  ;
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// check color target
		testColorAttachment();

		// check depth target
		testDepthAttachment();

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}